

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O2

int32 read_reg_mat(char *regmatfn,uint32 **veclen,uint32 *n_class,uint32 *n_stream,float32 *****A,
                  float32 ****B)

{
  uint32 *puVar1;
  uint uVar2;
  int32 iVar3;
  FILE *__stream;
  float32 ***pppfVar4;
  float32 **ppfVar5;
  float32 *pfVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint32 nstream;
  ulong local_88;
  float32 ***local_80;
  float32 ****local_78;
  uint32 nclass;
  uint32 *local_68;
  float32 *****local_60;
  float32 ****local_58;
  uint32 *local_50;
  uint32 **local_48;
  uint32 *local_40;
  float32 dummy;
  
  local_50 = n_class;
  local_48 = veclen;
  local_40 = n_stream;
  __stream = fopen(regmatfn,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
            ,0x66,"Unable to open %s to read MLLR matrices\n",regmatfn);
    iVar3 = -1;
  }
  else {
    local_60 = A;
    local_58 = B;
    __isoc99_fscanf(__stream,"%d",&nclass);
    __isoc99_fscanf(__stream,"%d",&nstream);
    local_68 = (uint32 *)
               __ckd_calloc__((ulong)nstream,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                              ,0x6c);
    local_78 = (float32 ****)
               __ckd_calloc_2d__((ulong)nclass,(ulong)nstream,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                 ,0x6d);
    pppfVar4 = (float32 ***)
               __ckd_calloc_2d__((ulong)nclass,(ulong)nstream,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                 ,0x6e);
    uVar12 = 0;
    local_80 = pppfVar4;
    while (uVar12 < nclass) {
      local_88 = uVar12;
      for (uVar7 = 0; puVar1 = local_68, uVar7 < nstream; uVar7 = uVar7 + 1) {
        puVar10 = local_68 + uVar7;
        __isoc99_fscanf(__stream,"%d",puVar10);
        ppfVar5 = (float32 **)
                  __ckd_calloc_2d__((ulong)puVar1[uVar7],(ulong)puVar1[uVar7],4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                    ,0x72);
        uVar12 = local_88;
        local_78[local_88][uVar7] = ppfVar5;
        pfVar6 = (float32 *)
                 __ckd_calloc__((ulong)puVar1[uVar7],4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
                                ,0x73);
        local_80[uVar12][uVar7] = pfVar6;
        uVar2 = puVar1[uVar7];
        for (uVar12 = 0; pppfVar4 = local_80, uVar12 < uVar2; uVar12 = uVar12 + 1) {
          lVar9 = 0;
          for (uVar11 = 0; uVar11 < uVar2; uVar11 = uVar11 + 1) {
            __isoc99_fscanf(__stream,"%f ",(long)local_78[local_88][uVar7][uVar12] + lVar9);
            uVar2 = *puVar10;
            lVar9 = lVar9 + 4;
          }
        }
        lVar9 = 0;
        for (uVar12 = 0; uVar12 < uVar2; uVar12 = uVar12 + 1) {
          __isoc99_fscanf(__stream,"%f ",(long)pppfVar4[local_88][uVar7] + lVar9);
          uVar2 = *puVar10;
          lVar9 = lVar9 + 4;
        }
        for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
          __isoc99_fscanf(__stream,"%f ",&dummy);
          uVar2 = *puVar10;
        }
        pppfVar4 = local_80;
      }
      uVar12 = local_88 + 1;
    }
    *local_50 = nclass;
    *local_40 = nstream;
    *local_48 = local_68;
    *local_60 = local_78;
    *local_58 = pppfVar4;
    fclose(__stream);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int32
read_reg_mat (
             const char   *regmatfn,
             uint32  **veclen,
             uint32  *n_class,
             uint32  *n_stream,
             float32 *****A,
             float32 ****B
            )
{
    uint32 i,j,k,m,nstream,nclass;
    FILE  *fp;
    uint32 *vlen;
    float32 ****lA,***lB;

    if ((fp = fopen(regmatfn,"r")) == NULL) {
	E_INFO("Unable to open %s to read MLLR matrices\n",regmatfn);
	return S3_ERROR;
    }

    fscanf(fp,"%d",&nclass);
    fscanf(fp,"%d",&nstream);
    vlen = (uint32 *)ckd_calloc(nstream,sizeof(uint32));
    lA = (float32 ****)ckd_calloc_2d (nclass,nstream,sizeof (float32 **));
    lB = (float32 ***)ckd_calloc_2d (nclass,nstream,sizeof (float32 *));
    for (m = 0; m < nclass; ++m) {
	for (i = 0; i < nstream; ++i) {
	    fscanf(fp,"%d", &vlen[i]);
	    lA[m][i] = (float32 **) ckd_calloc_2d(vlen[i],vlen[i],sizeof(float32));
	    lB[m][i] = (float32 *) ckd_calloc(vlen[i],sizeof(float32));
	    for (j = 0; j < vlen[i]; j++) {
		for (k = 0; k < vlen[i]; ++k) {
		    fscanf(fp,"%f ",&lA[m][i][j][k]);
		}
	    }
	    for (j = 0; j < vlen[i]; j++) {
		fscanf(fp,"%f ",&lB[m][i][j]);
	    }
	    /* Identity transform for variances. */
	    for (j = 0; j < vlen[i]; j++) {
		float32 dummy;
		fscanf(fp,"%f ",&dummy);
	    }
	}
    }

    *n_class = nclass;
    *n_stream = nstream;
    *veclen = vlen;
    *A = lA;
    *B = lB;

    fclose(fp);
    return S3_SUCCESS;
}